

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_add(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  REF_INT *pRVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int local_34;
  
  if (2 < (uint)type) {
    return 3;
  }
  uVar2 = ref_geom_find(ref_geom,node,type,id,&local_34);
  if (uVar2 == 0) {
    if (type == 0) {
      return 0;
    }
    pRVar4 = ref_geom->param;
    pRVar4[(long)local_34 * 2] = *param;
    if (type != 2) {
      return 0;
    }
    pRVar4[(int)(local_34 * 2 | 1)] = param[1];
    return 0;
  }
  if (uVar2 != 5) {
    pcVar9 = "find failed";
    uVar5 = 0x207;
    goto LAB_0014240d;
  }
  uVar6 = (ulong)(uint)ref_geom->blank;
  if (ref_geom->blank != 0xffffffff) {
    pRVar3 = ref_geom->descr;
    pRVar4 = ref_geom->param;
LAB_001421c1:
    iVar1 = (int)uVar6;
    iVar7 = iVar1 * 6 + 1;
    ref_geom->blank = pRVar3[iVar7];
    lVar12 = (long)(iVar1 * 6);
    pRVar3[lVar12] = type;
    pRVar3[iVar7] = id;
    pRVar3[lVar12 + 2] = id;
    (pRVar3 + lVar12 + 3)[0] = 0;
    (pRVar3 + lVar12 + 3)[1] = 0;
    pRVar3[lVar12 + 5] = node;
    pRVar4[iVar1 * 2] = 0.0;
    (pRVar4 + iVar1 * 2)[1] = 0.0;
    if ((type != 0) && (pRVar4[iVar1 * 2] = *param, type == 2)) {
      pRVar4[iVar1 * 2 + 1] = param[1];
    }
    uVar2 = ref_adj_add(ref_geom->ref_adj,node,iVar1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x226,
             "ref_geom_add",(ulong)uVar2,"register geom");
      pRVar3 = ref_geom->descr;
      printf("register node %d geom %d type %d id %d\n",(ulong)(uint)pRVar3[lVar12 + 5],
             uVar6 & 0xffffffff,(ulong)(uint)pRVar3[lVar12],(ulong)(uint)pRVar3[iVar7]);
      return uVar2;
    }
    ref_geom->n = ref_geom->n + 1;
    return 0;
  }
  iVar1 = ref_geom->max;
  uVar6 = (ulong)iVar1;
  if (uVar6 == 0x2aaaaaaa) {
    pcVar9 = "the number of geoms is too large for integers, cannot grow";
    uVar5 = 0x1d6;
LAB_001423df:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
           "ref_geom_grow",pcVar9);
    uVar2 = 1;
  }
  else {
    if (0x2aaaaaa9 < iVar1) {
      pcVar9 = "chunk limit at max";
      uVar5 = 0x1dc;
      goto LAB_001423df;
    }
    uVar2 = 1000;
    if (1000 < (int)((double)iVar1 * 1.5)) {
      uVar2 = (int)((double)iVar1 * 1.5);
    }
    if (0x2aaaaaaaU - iVar1 <= uVar2) {
      uVar2 = 0x2aaaaaaaU - iVar1;
    }
    ref_geom->max = uVar2 + iVar1;
    fflush(_stdout);
    if (ref_geom->max < 1) {
      pRVar3 = ref_geom->descr;
    }
    else {
      pRVar3 = (REF_INT *)realloc(ref_geom->descr,(ulong)(uint)ref_geom->max * 0x18);
      ref_geom->descr = pRVar3;
    }
    if (pRVar3 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1e2,
             "ref_geom_grow","realloc ref_geom->descr NULL");
      uVar6 = (long)ref_geom->max * 6;
      lVar12 = (long)ref_geom->max * 0x18;
      uVar5 = 4;
    }
    else {
      fflush(_stdout);
      if (ref_geom->max < 1) {
        pRVar4 = ref_geom->param;
      }
      else {
        pRVar4 = (REF_DBL *)realloc(ref_geom->param,(ulong)(uint)ref_geom->max << 4);
        ref_geom->param = pRVar4;
      }
      if (pRVar4 != (REF_DBL *)0x0) {
        iVar7 = ref_geom->max;
        pRVar3 = ref_geom->descr;
        if (iVar1 < iVar7) {
          pRVar8 = pRVar3 + uVar6 * 6 + 1;
          uVar10 = uVar6;
          iVar11 = iVar1;
          do {
            iVar11 = iVar11 + 1;
            pRVar8[-1] = -1;
            uVar10 = uVar10 + 1;
            *pRVar8 = iVar11;
            iVar7 = ref_geom->max;
            pRVar8 = pRVar8 + 6;
          } while ((long)uVar10 < (long)iVar7);
        }
        pRVar3[iVar7 * 6 + -5] = -1;
        ref_geom->blank = iVar1;
        goto LAB_001421c1;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1e3,
             "ref_geom_grow","realloc ref_geom->param NULL");
      uVar6 = (long)ref_geom->max * 2;
      lVar12 = (long)ref_geom->max << 4;
      uVar5 = 8;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar6 & 0xffffffff,uVar6,uVar5
           ,lVar12);
    uVar2 = 2;
  }
  pcVar9 = "grow add";
  uVar5 = 0x210;
LAB_0014240d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_add",(ulong)uVar2,pcVar9);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;
  REF_STATUS status;

  if (type < 0 || 2 < type) return REF_INVALID;

  status = ref_geom_find(ref_geom, node, type, id, &geom);
  RXS(status, REF_NOT_FOUND, "find failed");

  if (REF_SUCCESS == status) {
    if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
    if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_geom_blank(ref_geom)) {
    RSS(ref_geom_grow(ref_geom), "grow add");
  }

  geom = ref_geom_blank(ref_geom);
  ref_geom_blank(ref_geom) = ref_geom_id(ref_geom, geom);

  ref_geom_type(ref_geom, geom) = type;
  ref_geom_id(ref_geom, geom) = id;
  ref_geom_gref(ref_geom, geom) = id; /* assume same until set */
  ref_geom_jump(ref_geom, geom) = 0;
  ref_geom_degen(ref_geom, geom) = 0;
  ref_geom_node(ref_geom, geom) = node;

  ref_geom_param(ref_geom, 0, geom) = 0.0;
  ref_geom_param(ref_geom, 1, geom) = 0.0;
  if (type > 0) ref_geom_param(ref_geom, 0, geom) = param[0];
  if (type > 1) ref_geom_param(ref_geom, 1, geom) = param[1];

  RSB(ref_adj_add(ref_geom->ref_adj, node, geom), "register geom", {
    printf("register node %d geom %d type %d id %d\n",
           ref_geom_node(ref_geom, geom), geom, ref_geom_type(ref_geom, geom),
           ref_geom_id(ref_geom, geom));
  });

  ref_geom_n(ref_geom)++;

  return REF_SUCCESS;
}